

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

void __thiscall wasm::SIMDTernary::finalize(SIMDTernary *this)

{
  Expression *pEVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  
  pEVar1 = this->a;
  if (((pEVar1 != (Expression *)0x0) && (pEVar2 = this->b, pEVar2 != (Expression *)0x0)) &&
     (pEVar3 = this->c, pEVar3 != (Expression *)0x0)) {
    (this->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression.type.id = 6;
    if ((((pEVar1->type).id == 1) || ((pEVar2->type).id == 1)) || ((pEVar3->type).id == 1)) {
      (this->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression.type.id = 1;
    }
    return;
  }
  __assert_fail("a && b && c",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x1a2,"void wasm::SIMDTernary::finalize()");
}

Assistant:

void SIMDTernary::finalize() {
  assert(a && b && c);
  type = Type::v128;
  if (a->type == Type::unreachable || b->type == Type::unreachable ||
      c->type == Type::unreachable) {
    type = Type::unreachable;
  }
}